

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_block.cpp
# Opt level: O1

int32_t __thiscall cppnet::BufferBlock::MoveReadPt(BufferBlock *this,int32_t len)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  pcVar2 = this->_buffer_start;
  if (pcVar2 == (char *)0x0) {
    return 0;
  }
  if (len < 1) {
    uVar4 = -len;
    pcVar3 = this->_read;
    pcVar1 = this->_write;
    if (pcVar1 < pcVar3) {
      uVar5 = (int)pcVar3 - (int)pcVar1;
      if (uVar5 == uVar4 || SBORROW4(uVar5,uVar4) != (int)(uVar5 + len) < 0) {
LAB_001179a0:
        this->_read = pcVar1;
        this->_can_read = true;
        return uVar5;
      }
      pcVar3 = pcVar3 + -(ulong)uVar4;
    }
    else {
      if ((pcVar1 == pcVar3) && (this->_can_read != false)) {
        return 0;
      }
      iVar6 = (int)((long)pcVar3 - (long)pcVar2);
      uVar5 = (int)this->_buffer_end + (iVar6 - (int)pcVar1);
      if (uVar5 == uVar4 || SBORROW4(uVar5,uVar4) != (int)(uVar5 + len) < 0) goto LAB_001179a0;
      if (-iVar6 != len && iVar6 <= (int)uVar4) {
        pcVar2 = this->_buffer_end + (((long)pcVar3 - (long)pcVar2) - (ulong)uVar4);
        goto LAB_0011799a;
      }
      pcVar3 = pcVar3 + -(ulong)uVar4;
    }
LAB_001179b2:
    this->_read = pcVar3;
  }
  else {
    pcVar3 = this->_read;
    pcVar1 = this->_write;
    if (pcVar3 < pcVar1) {
      uVar4 = (int)pcVar1 - (int)pcVar3;
      if (len < (int)uVar4) {
        pcVar3 = pcVar3 + (uint)len;
        uVar4 = len;
        goto LAB_001179b2;
      }
    }
    else {
      if ((pcVar3 == pcVar1) && (this->_can_read == false)) {
        return 0;
      }
      lVar7 = (long)this->_buffer_end - (long)pcVar3;
      iVar6 = (int)lVar7;
      uVar4 = iVar6 + ((int)pcVar1 - (int)pcVar2);
      if (len < (int)uVar4) {
        if (iVar6 < len) {
          pcVar2 = pcVar2 + ((ulong)(uint)len - lVar7);
          uVar4 = len;
LAB_0011799a:
          this->_read = pcVar2;
          return uVar4;
        }
        pcVar3 = pcVar3 + (uint)len;
        uVar4 = len;
        goto LAB_001179b2;
      }
    }
    (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[4])();
  }
  return uVar4;
}

Assistant:

int32_t BufferBlock::MoveReadPt(int32_t len) {
    if (!_buffer_start) {
        return 0;
    }

    if (len > 0) {
        /*s-----------r-----w-------------e*/
        if (_read < _write) {
            size_t size = _write - _read;
            // res can load all
            if ((int32_t)size <= len) {
                Clear();
                return (int32_t)size;

            // only read len
            } else {
                _read += len;
                return len;
            }

        /*s-----------w-----r-------------e*/
        /*s-----------wr------------------e*/
        } else {
            if(!_can_read && _read == _write) {
                return 0;
            }
            size_t size_start = _write - _buffer_start;
            size_t size_end = _buffer_end - _read;
            size_t size =  size_start + size_end;
            // res can load all
            if ((int32_t)size <= len) {
                Clear();
                return (int32_t)size;

            // only read len
            } else {
                if (len <= (int32_t)size_end) {
                    _read += len;
                    return len;

                } else {
                    size_t left = len - size_end;
                    _read = _buffer_start + left;
                    return len;
                }
            }
        }

    } else {
        len = -len;
        /*s-----------w-----r-------------e*/
        if (_write < _read) {
            size_t size = _read - _write;
            // reread all buffer
            if ((int32_t)size <= len) {
                _read = _write;
                _can_read = true;
                return (int32_t)size;

            // only reread part of buffer
            } else {
                _read -= len;
                return len;
            }
        
        /*s-----------r-----w-------------e*/
        /*s-----------rw------------------e*/
        } else {
            if(_can_read && _read == _write) {
                return 0;
            }
            size_t size_start = _read - _buffer_start;
            size_t size_end = _buffer_end - _write;
            size_t size =  size_start + size_end;
            // reread all buffer
            if ((int32_t)size <= len) {
                _read = _write;
                _can_read = true;
                return (int32_t)size;

            // only reread part of buffer
            } else {
                if (len <= (int32_t)size_start) {
                    _read -= len;
                    return len;

                } else {
                    size_t left = len - size_start;
                    _read = _buffer_end - left;
                    return len;
                }
            }
        }
    }
}